

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.cpp
# Opt level: O2

void duckdb::TemplatedGenerateSequence<signed_char>
               (Vector *result,idx_t count,int64_t start,int64_t increment)

{
  data_ptr_t pdVar1;
  InternalException *this;
  idx_t iVar2;
  byte bVar3;
  char cVar4;
  allocator local_51;
  string local_50;
  
  if ((start < 0x80) && (increment < 0x80)) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      cVar4 = (char)increment;
      if (iVar2 == 0) {
        cVar4 = '\0';
      }
      bVar3 = (char)start + cVar4;
      start = (int64_t)bVar3;
      pdVar1[iVar2] = bVar3;
    }
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Sequence start or increment out of type range",&local_51);
  InternalException::InternalException(this,&local_50);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemplatedGenerateSequence(Vector &result, idx_t count, int64_t start, int64_t increment) {
	D_ASSERT(result.GetType().IsNumeric());
	if (start > NumericLimits<T>::Maximum() || increment > NumericLimits<T>::Maximum()) {
		throw InternalException("Sequence start or increment out of type range");
	}
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<T>(result);
	auto value = T(start);
	for (idx_t i = 0; i < count; i++) {
		if (i > 0) {
			value += increment;
		}
		result_data[i] = value;
	}
}